

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int realloc_substr_buffer(size_t need_len,char **buffer,size_t *buffer_len)

{
  ulong size;
  char *pcVar1;
  size_t need_size;
  size_t *buffer_len_local;
  char **buffer_local;
  size_t need_len_local;
  
  size = ((need_len >> 6) + 2) * 0x40;
  if ((*buffer == (char *)0x0) || (*buffer_len < size)) {
    if (*buffer != (char *)0x0) {
      wally_free(*buffer);
    }
    pcVar1 = (char *)wally_malloc(size);
    *buffer = pcVar1;
    if (*buffer == (char *)0x0) {
      return -3;
    }
    *buffer_len = size;
  }
  return 0;
}

Assistant:

static int realloc_substr_buffer(size_t need_len, char **buffer, size_t *buffer_len)
{
    size_t need_size = ((need_len / 64) + 2) * 64;
    if ((*buffer == NULL) || (need_size > *buffer_len)) {
        if (*buffer != NULL)
            wally_free(*buffer);

        *buffer = (char *) wally_malloc(need_size);
        if (*buffer == NULL)
            return WALLY_ENOMEM;

        *buffer_len = need_size;
    }
    return WALLY_OK;
}